

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
mpt::unique_array<mpt::metatype_*>::unique_array(unique_array<mpt::metatype_*> *this,long len)

{
  int iVar1;
  undefined4 extraout_var;
  content<mpt::metatype_*> *pcVar2;
  default_data *pdVar3;
  
  (this->_ref)._ref = (content<mpt::metatype_*> *)0x0;
  if (unique_array<mpt::metatype*>::unique_array(long)::_dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&unique_array<mpt::metatype*>::unique_array(long)::_dummy);
    if (iVar1 != 0) {
      unique_array::_dummy.super_content<mpt::metatype_*>.super_buffer._content_traits =
           type_properties<mpt::metatype_*>::traits();
      unique_array::_dummy.super_content<mpt::metatype_*>.super_buffer._size = 0;
      unique_array::_dummy.super_content<mpt::metatype_*>.super_buffer._used = 0;
      unique_array::_dummy.super_content<mpt::metatype_*>.super_buffer._vptr_buffer =
           (_func_int **)&PTR_get_flags_00108b90;
      __cxa_guard_release(&unique_array<mpt::metatype*>::unique_array(long)::_dummy);
    }
  }
  if (len < 0) {
    pdVar3 = &unique_array::_dummy;
  }
  else {
    iVar1 = (*unique_array::_dummy.super_content<mpt::metatype_*>.super_buffer._vptr_buffer[3])
                      (&unique_array::_dummy,len << 3);
    pdVar3 = (default_data *)CONCAT44(extraout_var,iVar1);
  }
  pcVar2 = (this->_ref)._ref;
  if (pcVar2 != (content<mpt::metatype_*> *)0x0) {
    (*(pcVar2->super_buffer)._vptr_buffer[1])();
  }
  pcVar2 = &unique_array::_dummy.super_content<mpt::metatype_*>;
  if (&pdVar3->super_content<mpt::metatype_*> != (content<mpt::metatype_*> *)0x0) {
    pcVar2 = &pdVar3->super_content<mpt::metatype_*>;
  }
  (this->_ref)._ref = pcVar2;
  return;
}

Assistant:

unique_array(long len = -1)
	{
		static default_data _dummy;
		content<T> *data = &_dummy;
		if (len >= 0) data = data->detach(len * sizeof(T));
		_ref.set_instance(data ? data : &_dummy);
	}